

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.tab.hh
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
tchecker::parsing::program::parser_t::value_type::as<std::__cxx11::string>(value_type *this)

{
  bool bVar1;
  
  if (this->yytypeid_ == (type_info *)0x0) {
    __assert_fail("yytypeid_",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O2/src/parsing/program_parser/program.tab.hh"
                  ,0x144,
                  "T &tchecker::parsing::program::parser_t::value_type::as() [T = std::basic_string<char>]"
                 );
  }
  bVar1 = std::type_info::operator==(this->yytypeid_,(type_info *)&std::__cxx11::string::typeinfo);
  if (bVar1) {
    return (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  }
  __assert_fail("*yytypeid_ == typeid (T)",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O2/src/parsing/program_parser/program.tab.hh"
                ,0x145,
                "T &tchecker::parsing::program::parser_t::value_type::as() [T = std::basic_string<char>]"
               );
}

Assistant:

T&
    as () YY_NOEXCEPT
    {
      PPYY_ASSERT (yytypeid_);
      PPYY_ASSERT (*yytypeid_ == typeid (T));
      PPYY_ASSERT (sizeof (T) <= size);
      return *yyas_<T> ();
    }